

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# payload.hpp
# Opt level: O2

void trackerboy::writePayloadImpl<trackerboy::SongHandler>
               (Module *mod,OutputBlock *block,SongHandler *handler)

{
  size_t sVar1;
  size_t i;
  size_t index;
  
  sVar1 = (handler->super_PayloadHandler<1196314451U>).mCount;
  for (index = 0; sVar1 != index; index = index + 1) {
    OutputBlock::begin(block,0x474e4f53);
    SongHandler::processOut(handler,mod,block,index);
    OutputBlock::finish(block);
  }
  return;
}

Assistant:

void writePayloadImpl(Module const& mod, OutputBlock &block, T& handler) {
    auto const count = handler.count();
    for (size_t i = 0; i < count; ++i) {
        block.begin(handler.id());
        handler.processOut(mod, block, i);
        block.finish();
    }
}